

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcBlast.c
# Opt level: O1

void Wlc_BlastDivider2(Gia_Man_t *pNew,int *pNum,int nNum,int *pDiv,int nDiv,int fQuo,
                      Vec_Int_t *vRes)

{
  int b;
  int c;
  Vec_Int_t *p;
  int *piVar1;
  int *piVar2;
  int *__ptr;
  int iVar3;
  int iVar4;
  ulong uVar5;
  uint uVar6;
  ulong uVar7;
  int *ps;
  undefined4 in_register_00000014;
  ulong uVar8;
  int Temp;
  int local_a0;
  int local_9c;
  Vec_Int_t *local_98;
  ulong local_90;
  int local_88;
  int local_84;
  ulong local_80;
  int *local_78;
  int *local_70;
  ulong local_68;
  int *local_60;
  int *local_58;
  int *local_50;
  ulong local_48;
  ulong local_40;
  ulong local_38;
  
  local_90 = CONCAT44(in_register_00000014,nNum);
  uVar8 = (ulong)(uint)nDiv;
  local_98 = vRes;
  local_78 = vRes->pArray;
  local_88 = fQuo;
  local_60 = (int *)malloc((long)nNum * 4);
  if ((nNum < 1) || (nDiv < 1)) {
    __assert_fail("nNum > 0 && nDiv > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/wlc/wlcBlast.c"
                  ,0x275,
                  "void Wlc_BlastDivider2(Gia_Man_t *, int *, int, int *, int, int, Vec_Int_t *)");
  }
  uVar6 = nDiv + (int)local_90;
  if ((int)uVar6 <= local_98->nSize) {
    __assert_fail("Vec_IntSize(vRes) < nNum + nDiv",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/wlc/wlcBlast.c"
                  ,0x276,
                  "void Wlc_BlastDivider2(Gia_Man_t *, int *, int, int *, int, int, Vec_Int_t *)");
  }
  local_68 = local_90 & 0xffffffff;
  uVar5 = 1;
  if (1 < (int)uVar6) {
    uVar5 = (ulong)uVar6;
  }
  uVar7 = 0;
  do {
    iVar4 = 0;
    if (uVar7 < local_68) {
      iVar4 = pNum[uVar7];
    }
    local_78[uVar7] = iVar4;
    uVar7 = uVar7 + 1;
  } while (uVar5 != uVar7);
  uVar5 = (ulong)((int)local_90 - 1);
  local_40 = (ulong)(nDiv + 1);
  local_58 = local_78 + uVar8;
  ps = local_78 + uVar5;
  local_90 = uVar5;
  local_80 = uVar8;
  local_70 = pDiv;
  local_38 = uVar8;
  do {
    iVar4 = 1;
    if (uVar5 != local_90) {
      iVar4 = local_60[uVar5 + 1];
    }
    uVar8 = 0;
    local_9c = iVar4;
    local_50 = ps;
    local_48 = uVar5;
    do {
      c = local_9c;
      iVar3 = 0;
      if (uVar8 < local_38) {
        iVar3 = local_70[uVar8];
      }
      b = *ps;
      iVar3 = Gia_ManHashXor(pNew,iVar3,iVar4);
      Wlc_BlastFullAdder(pNew,iVar3,b,c,&local_9c,ps);
      __ptr = local_60;
      uVar7 = local_68;
      piVar2 = local_70;
      piVar1 = local_78;
      p = local_98;
      uVar8 = uVar8 + 1;
      ps = ps + 1;
    } while (local_40 != uVar8);
    if (local_58[local_48] < 0) {
      __assert_fail("Lit >= 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                    ,0x131,"int Abc_LitNot(int)");
    }
    local_60[local_48] = local_58[local_48] ^ 1;
    uVar5 = local_48 - 1;
    ps = local_50 + -1;
  } while (0 < (int)local_48);
  if (local_88 == 0) {
    local_a0 = 0;
    uVar8 = 1;
    if (1 < (int)local_80) {
      uVar8 = local_80 & 0xffffffff;
    }
    uVar5 = 0;
    do {
      Wlc_BlastFullAdder(pNew,piVar2[uVar5],piVar1[uVar5],local_a0,&local_a0,&local_84);
      iVar4 = Gia_ManHashMux(pNew,*__ptr,piVar1[uVar5],local_84);
      piVar1[uVar5] = iVar4;
      uVar5 = uVar5 + 1;
    } while (uVar8 != uVar5);
    if (local_98->nSize < (int)local_80) {
      __assert_fail("p->nSize >= nSizeNew",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                    ,0x2b7,"void Vec_IntShrink(Vec_Int_t *, int)");
    }
    local_98->nSize = (int)local_80;
  }
  else {
    local_98->nSize = 0;
    uVar8 = 0;
    do {
      Vec_IntPush(p,__ptr[uVar8]);
      uVar8 = uVar8 + 1;
    } while (uVar7 != uVar8);
  }
  if (__ptr == (int *)0x0) {
    return;
  }
  free(__ptr);
  return;
}

Assistant:

void Wlc_BlastDivider2( Gia_Man_t * pNew, int * pNum, int nNum, int * pDiv, int nDiv, int fQuo, Vec_Int_t * vRes )
{
    int i, * pRes  = Vec_IntArray(vRes);
    int k, * pQuo  = ABC_ALLOC( int, nNum );
    assert( nNum > 0 && nDiv > 0 );
    assert( Vec_IntSize(vRes) < nNum + nDiv );
    for ( i = 0; i < nNum + nDiv; i++ )
        pRes[i] = i < nNum ? pNum[i] : 0;
    for ( i = nNum-1; i >= 0; i-- )
    {
        int Cntrl = i == nNum-1 ? 1 : pQuo[i+1];
        int Carry = Cntrl;
        for ( k = 0; k <= nDiv; k++ )
            Wlc_BlastFullAdderSubtr( pNew, k < nDiv ? pDiv[k] : 0, pRes[i+k], Carry, &Carry, &pRes[i+k], Cntrl );
        pQuo[i] = Abc_LitNot(pRes[i+nDiv]);
    }
    if ( fQuo )
        Wlc_VecCopy( vRes, pQuo, nNum );
    else
    {
        int Carry = 0, Temp;
        for ( k = 0; k < nDiv; k++ )
        {
            Wlc_BlastFullAdder( pNew, pDiv[k], pRes[k], Carry, &Carry, &Temp );
            pRes[k] = Gia_ManHashMux( pNew, pQuo[0], pRes[k], Temp );
        }
        Vec_IntShrink( vRes, nDiv );
    }
    ABC_FREE( pQuo );
}